

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

XrLoaderLogMessageSeverityFlags
DebugUtilsSeveritiesToLoaderLogMessageSeverities
          (XrDebugUtilsMessageSeverityFlagsEXT utils_severities)

{
  ulong local_18;
  XrLoaderLogMessageSeverityFlags log_severities;
  XrDebugUtilsMessageSeverityFlagsEXT utils_severities_local;
  
  local_18 = (ulong)((utils_severities & 1) != 0);
  if ((utils_severities & 0x10) != 0) {
    local_18 = local_18 | 0x10;
  }
  if ((utils_severities & 0x100) != 0) {
    local_18 = local_18 | 0x100;
  }
  if ((utils_severities & 0x1000) != 0) {
    local_18 = local_18 | 0x1000;
  }
  return local_18;
}

Assistant:

XrLoaderLogMessageSeverityFlags DebugUtilsSeveritiesToLoaderLogMessageSeverities(
    XrDebugUtilsMessageSeverityFlagsEXT utils_severities) {
    XrLoaderLogMessageSeverityFlags log_severities = 0UL;
    if ((utils_severities & XR_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT) != 0u) {
        log_severities |= XR_LOADER_LOG_MESSAGE_SEVERITY_VERBOSE_BIT;
    }
    if ((utils_severities & XR_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT) != 0u) {
        log_severities |= XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT;
    }
    if ((utils_severities & XR_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT) != 0u) {
        log_severities |= XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT;
    }
    if ((utils_severities & XR_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT) != 0u) {
        log_severities |= XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT;
    }
    return log_severities;
}